

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

int Dar_RefactTryGraph(Aig_Man_t *pAig,Aig_Obj_t *pRoot,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph,
                      int NodeMax,int LevelMax)

{
  Kit_Node_t *pKVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  
  iVar11 = 0;
  if ((pGraph->fConst == 0) &&
     (iVar11 = 0, (uint)pGraph->nLeaves <= ((uint)pGraph->eRoot >> 1 & 0x3fffffff))) {
    iVar14 = 0;
    if (pGraph->nLeaves != 0) {
      lVar5 = 2;
      lVar13 = 0;
      do {
        if (vCut->nSize <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pKVar1 = pGraph->pNodes;
        pvVar2 = vCut->pArray[lVar13];
        *(void **)((long)pKVar1 + lVar5 * 8 + -8) = pvVar2;
        uVar15 = (ulong)pvVar2 & 0xfffffffffffffffe;
        (&pKVar1->eEdge0)[lVar5 * 2] =
             (Kit_Edge_t)
             ((uint)(&pKVar1->eEdge0)[lVar5 * 2] & 0xffffc000 | *(uint *)(uVar15 + 0x1c) & 0x3fff);
        if ((~*(ulong *)(uVar15 + 0x18) & 0xffffff00000000) == 0) {
          __assert_fail("Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darRefact.c"
                        ,0xf1,
                        "int Dar_RefactTryGraph(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Kit_Graph_t *, int, int)"
                       );
        }
        lVar13 = lVar13 + 1;
        iVar14 = pGraph->nLeaves;
        lVar5 = lVar5 + 3;
      } while (lVar13 < iVar14);
    }
    iVar11 = 0;
    if (iVar14 < pGraph->nSize) {
      lVar13 = (long)iVar14;
      lVar5 = lVar13 * 0x18 + 0x10;
      iVar11 = 0;
      do {
        pKVar1 = pGraph->pNodes;
        uVar7 = *(uint *)((long)pKVar1 + lVar5 + -0x10);
        uVar12 = *(uint *)((long)pKVar1 + lVar5 + -0xc);
        uVar8 = uVar7 >> 1 & 0x3fffffff;
        uVar9 = uVar12 >> 1 & 0x3fffffff;
        pFanin0 = (Aig_Obj_t *)pKVar1[uVar8].field_2.pFunc;
        pFanin1 = (Aig_Obj_t *)pKVar1[uVar9].field_2.pFunc;
        bVar4 = true;
        if ((pFanin0 == (Aig_Obj_t *)0x0) || (pFanin1 == (Aig_Obj_t *)0x0)) {
          pAVar6 = (Aig_Obj_t *)0x0;
LAB_0049589b:
          bVar3 = bVar4;
          if (NodeMax <= iVar11) {
            return -1;
          }
          iVar11 = iVar11 + 1;
        }
        else {
          pFanin0 = (Aig_Obj_t *)((ulong)pFanin0 ^ (ulong)(uVar7 & 1));
          pFanin1 = (Aig_Obj_t *)((ulong)pFanin1 ^ (ulong)(uVar12 & 1));
          pAVar6 = Aig_TableLookupTwo(pAig,pFanin0,pFanin1);
          if ((Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe) == pRoot) {
            return -1;
          }
          if (pAVar6 == (Aig_Obj_t *)0x0) {
            pAVar6 = (Aig_Obj_t *)0x0;
            goto LAB_0049589b;
          }
          bVar3 = false;
          bVar4 = false;
          if (((Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe))->TravId == pAig->nTravIds)
          goto LAB_0049589b;
        }
        uVar12 = *(uint *)&pKVar1[uVar8].field_0x10 & 0x3fff;
        uVar7 = *(uint *)&pKVar1[uVar9].field_0x10 & 0x3fff;
        if (uVar7 < uVar12) {
          uVar7 = uVar12;
        }
        uVar7 = uVar7 + 1;
        if (!bVar3) {
          pAVar10 = (Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe);
          if (pAig->pConst1 == pAVar10) {
            uVar7 = 0;
          }
          else if ((pAVar10 == (Aig_Obj_t *)((ulong)pFanin0 & 0xfffffffffffffffe)) ||
                  (pAVar10 == (Aig_Obj_t *)((ulong)pFanin1 & 0xfffffffffffffffe))) {
            uVar7 = *(uint *)&pAVar10->field_0x1c & 0xffffff;
          }
        }
        if (LevelMax < (int)uVar7) {
          return -1;
        }
        *(Aig_Obj_t **)((long)pKVar1 + lVar5 + -8) = pAVar6;
        *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar5) =
             *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar5) & 0xffffc000 | uVar7 & 0x3fff;
        lVar13 = lVar13 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar13 < pGraph->nSize);
    }
  }
  return iVar11;
}

Assistant:

int Dar_RefactTryGraph( Aig_Man_t * pAig, Aig_Obj_t * pRoot, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph, int NodeMax, int LevelMax )
{
    Kit_Node_t * pNode, * pNode0, * pNode1;
    Aig_Obj_t * pAnd, * pAnd0, * pAnd1;
    int i, Counter, LevelNew, LevelOld;
    // check for constant function or a literal
    if ( Kit_GraphIsConst(pGraph) || Kit_GraphIsVar(pGraph) )
        return 0;
    // set the levels of the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry(vCut, i);
        pNode->Level = Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level;
        assert( Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1 );
    }
//printf( "Trying:\n" );
    // compute the AIG size after adding the internal nodes
    Counter = 0;
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Kit_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Kit_GraphNode( pGraph, pNode->eEdge1.Node );
        // get the AIG nodes corresponding to the children 
        pAnd0 = (Aig_Obj_t *)pNode0->pFunc; 
        pAnd1 = (Aig_Obj_t *)pNode1->pFunc; 
        if ( pAnd0 && pAnd1 )
        {
            // if they are both present, find the resulting node
            pAnd0 = Aig_NotCond( pAnd0, pNode->eEdge0.fCompl );
            pAnd1 = Aig_NotCond( pAnd1, pNode->eEdge1.fCompl );
            pAnd  = Aig_TableLookupTwo( pAig, pAnd0, pAnd1 );
            // return -1 if the node is the same as the original root
            if ( Aig_Regular(pAnd) == pRoot )
                return -1;
        }
        else
            pAnd = NULL;
        // count the number of added nodes
        if ( pAnd == NULL || Aig_ObjIsTravIdCurrent(pAig, Aig_Regular(pAnd)) )
        {
            if ( ++Counter > NodeMax )
                return -1;
        }
        // count the number of new levels
        LevelNew = 1 + Abc_MaxInt( pNode0->Level, pNode1->Level );
        if ( pAnd )
        {
            if ( Aig_Regular(pAnd) == Aig_ManConst1(pAig) )
                LevelNew = 0;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd0) )
                LevelNew = (int)Aig_Regular(pAnd0)->Level;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd1) )
                LevelNew = (int)Aig_Regular(pAnd1)->Level;
            LevelOld = (int)Aig_Regular(pAnd)->Level;
//            assert( LevelNew == LevelOld );
        }
        if ( LevelNew > LevelMax )
            return -1;
        pNode->pFunc = pAnd;
        pNode->Level = LevelNew;
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    return Counter;
}